

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  pointer puVar2;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i;
  pointer puVar3;
  
  InstructionList::ForEachInst(&this->capabilities_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->extensions_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->ext_inst_imports_,f,run_on_debug_line_insts);
  pIVar1 = (this->memory_model_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar1 != (Instruction *)0x0) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = (this->sampled_image_address_mode_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar1 != (Instruction *)0x0) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  InstructionList::ForEachInst(&this->entry_points_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->execution_modes_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs1_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs2_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs3_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->ext_inst_debuginfo_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->annotations_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->types_values_,f,run_on_debug_line_insts);
  puVar2 = (this->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    opt::Function::ForEachInst
              ((puVar3->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,f,
               run_on_debug_line_insts,true);
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(Instruction*)>& f,
                         bool run_on_debug_line_insts) {
#define DELEGATE(list) list.ForEachInst(f, run_on_debug_line_insts)
  DELEGATE(capabilities_);
  DELEGATE(extensions_);
  DELEGATE(ext_inst_imports_);
  if (memory_model_) memory_model_->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    sampled_image_address_mode_->ForEachInst(f, run_on_debug_line_insts);
  DELEGATE(entry_points_);
  DELEGATE(execution_modes_);
  DELEGATE(debugs1_);
  DELEGATE(debugs2_);
  DELEGATE(debugs3_);
  DELEGATE(ext_inst_debuginfo_);
  DELEGATE(annotations_);
  DELEGATE(types_values_);
  for (auto& i : functions_) {
    i->ForEachInst(f, run_on_debug_line_insts,
                   /* run_on_non_semantic_insts = */ true);
  }
#undef DELEGATE
}